

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglApiCase.cpp
# Opt level: O0

void __thiscall deqp::egl::ApiCase::expectNull(ApiCase *this,void *got)

{
  qpTestResult qVar1;
  TestLog *this_00;
  MessageBuilder *this_01;
  MessageBuilder local_198;
  void *local_18;
  void *got_local;
  ApiCase *this_local;
  
  if (got != (void *)0x0) {
    local_18 = got;
    got_local = this;
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_198,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    this_01 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [24])"// ERROR expected: NULL");
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_198);
    qVar1 = tcu::TestContext::getTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Got invalid value");
    }
  }
  return;
}

Assistant:

void ApiCase::expectNull (const void* got)
{
	if (got != DE_NULL)
	{
		m_testCtx.getLog() << TestLog::Message << "// ERROR expected: NULL" << TestLog::EndMessage;
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid value");
	}
}